

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Node::EndAscii(Node *this,ostream *s,int indent,bool has_children)

{
  int local_24;
  int i;
  bool has_children_local;
  int indent_local;
  ostream *s_local;
  Node *this_local;
  
  if (has_children) {
    std::operator<<(s,'\n');
    for (local_24 = 0; local_24 < indent; local_24 = local_24 + 1) {
      std::operator<<(s,'\t');
    }
    std::operator<<(s,"}");
  }
  return;
}

Assistant:

void FBX::Node::EndAscii(std::ostream& s, int indent, bool has_children)
{
    if (!has_children) { return; } // nothing to do
    s << '\n';
    for (int i = 0; i < indent; ++i) { s << '\t'; }
    s << "}";
}